

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O0

bool __thiscall libebml::EbmlMaster::CheckMandatory(EbmlMaster *this)

{
  bool bVar1;
  size_t sVar2;
  EbmlElement *pEVar3;
  bool hasDefaultValue;
  EbmlElement *testElement;
  uint EltIdx;
  EbmlMaster *this_local;
  
  sVar2 = EbmlSemanticContext::GetSize(this->Context);
  if (sVar2 == 0) {
    __assert_fail("Context.GetSize() != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlMaster.cpp"
                  ,0xc9,"bool libebml::EbmlMaster::CheckMandatory() const");
  }
  testElement._4_4_ = 0;
  do {
    if (this->Context->Size <= (ulong)testElement._4_4_) {
      return true;
    }
    bVar1 = EbmlSemantic::IsMandatory(this->Context->MyTable + testElement._4_4_);
    if ((bVar1) &&
       (pEVar3 = FindElt(this,this->Context->MyTable[testElement._4_4_].GetCallbacks),
       pEVar3 == (EbmlElement *)0x0)) {
      pEVar3 = EbmlSemantic::Create(this->Context->MyTable + testElement._4_4_);
      bVar1 = EbmlElement::DefaultISset(pEVar3);
      if (pEVar3 != (EbmlElement *)0x0) {
        (*pEVar3->_vptr_EbmlElement[1])();
      }
      if (!bVar1) {
        return false;
      }
    }
    testElement._4_4_ = testElement._4_4_ + 1;
  } while( true );
}

Assistant:

bool EbmlMaster::CheckMandatory() const
{
  assert(Context.GetSize() != 0);

  unsigned int EltIdx;
  for (EltIdx = 0; EltIdx < EBML_CTX_SIZE(Context); EltIdx++) {
    if (EBML_CTX_IDX(Context,EltIdx).IsMandatory()) {
      if (FindElt(EBML_CTX_IDX_INFO(Context,EltIdx)) == NULL) {
        EbmlElement *testElement = &EBML_CTX_IDX(Context,EltIdx).Create();
        bool hasDefaultValue     = testElement->DefaultISset();
        delete testElement;

#if defined(LIBEBML_DEBUG)
        // you are missing this Mandatory element
//         const char * MissingName = EBML_INFO_NAME(EBML_CTX_IDX_INFO(Context,EltIdx));
#endif // LIBEBML_DEBUG
        if (!hasDefaultValue)
          return false;
      }
    }
  }

  return true;
}